

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator<char> local_61;
  string local_60 [32];
  _InputArray local_40;
  _Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  local_28;
  
  std::__cxx11::string::string<std::allocator<char>>(local_60,"w1",(allocator<char> *)&local_40);
  cv::namedWindow(local_60,1);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"w1",(allocator<char> *)&local_40);
  cv::setMouseCallback(local_60,click_callback,(void *)0x0);
  std::__cxx11::string::~string(local_60);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"w1",&local_61);
  local_40.sz.width = 0;
  local_40.sz.height = 0;
  local_40.flags = -0x7efeffeb;
  local_40.obj = &frame;
  cv::imshow(local_60,&local_40);
  std::__cxx11::string::~string(local_60);
  cv::waitKey(0);
  fit_and_draw_spline<HermiteSpline<3u,2u>>();
  std::_Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
  ::~_Vector_base(&local_28);
  cv::waitKey(0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    namedWindow(WINDOW1, 1);
    setMouseCallback(WINDOW1, click_callback, NULL);

    cout << "Click on a spot with the left mouse button and hold down CTRL to add a point to the spline." << endl;

    imshow(WINDOW1, frame);
    waitKey(0);

    fit_and_draw_spline<CubicHermiteSpline<2>>();
    waitKey(0);

    return 0;
}